

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_fcc_cond(DisasCompare_conflict *c,DisasContext_conflict2 *s,int cond)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  int iVar2;
  int iVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  TCGv_i32 fpsr;
  TCGContext_conflict2 *tcg_ctx;
  int cond_local;
  DisasContext_conflict2 *s_local;
  DisasCompare_conflict *c_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  c->g1 = true;
  pTVar4 = tcg_const_i32_m68k(tcg_ctx_00,0);
  c->v2 = pTVar4;
  c->g2 = false;
  pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
  gen_load_fcr(s,pTVar4,2);
  switch(cond) {
  case 0:
  case 0x10:
    c->v1 = c->v2;
    c->tcond = TCG_COND_NEVER;
    break;
  case 1:
  case 0x11:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0x4000000);
    c->tcond = TCG_COND_NE;
    break;
  case 2:
  case 0x12:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0xd000000);
    c->tcond = TCG_COND_EQ;
    break;
  case 3:
  case 0x13:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0x1000000);
    pTVar5 = c->v1;
    pTVar1 = c->v1;
    iVar2 = ctz32(0x8000000);
    iVar3 = ctz32(0x1000000);
    tcg_gen_shli_i32_m68k(tcg_ctx_00,pTVar5,pTVar1,iVar2 - iVar3);
    tcg_gen_andi_i32_m68k(tcg_ctx_00,pTVar4,pTVar4,0xc000000);
    tcg_gen_or_i32(tcg_ctx_00,c->v1,c->v1,pTVar4);
    tcg_gen_xori_i32_m68k(tcg_ctx_00,c->v1,c->v1,0x8000000);
    c->tcond = TCG_COND_NE;
    break;
  case 4:
  case 0x14:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_xori_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0x8000000);
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,c->v1,0xd000000);
    c->tcond = TCG_COND_EQ;
    break;
  case 5:
  case 0x15:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0x1000000);
    pTVar5 = c->v1;
    pTVar1 = c->v1;
    iVar2 = ctz32(0x8000000);
    iVar3 = ctz32(0x1000000);
    tcg_gen_shli_i32_m68k(tcg_ctx_00,pTVar5,pTVar1,iVar2 - iVar3);
    tcg_gen_andc_i32_m68k(tcg_ctx_00,c->v1,pTVar4,c->v1);
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,c->v1,0xc000000);
    c->tcond = TCG_COND_NE;
    break;
  case 6:
  case 0x16:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0x5000000);
    c->tcond = TCG_COND_EQ;
    break;
  case 7:
  case 0x17:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0x1000000);
    c->tcond = TCG_COND_EQ;
    break;
  case 8:
  case 0x18:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0x1000000);
    c->tcond = TCG_COND_NE;
    break;
  case 9:
  case 0x19:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0x5000000);
    c->tcond = TCG_COND_NE;
    break;
  case 10:
  case 0x1a:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0x4000000);
    pTVar5 = c->v1;
    pTVar1 = c->v1;
    iVar2 = ctz32(0x8000000);
    iVar3 = ctz32(0x4000000);
    tcg_gen_shli_i32_m68k(tcg_ctx_00,pTVar5,pTVar1,iVar2 - iVar3);
    tcg_gen_andi_i32_m68k(tcg_ctx_00,pTVar4,pTVar4,0x9000000);
    tcg_gen_or_i32(tcg_ctx_00,c->v1,c->v1,pTVar4);
    tcg_gen_xori_i32_m68k(tcg_ctx_00,c->v1,c->v1,0x8000000);
    c->tcond = TCG_COND_NE;
    break;
  case 0xb:
  case 0x1b:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0xd000000);
    tcg_gen_xori_i32_m68k(tcg_ctx_00,c->v1,c->v1,0x8000000);
    c->tcond = TCG_COND_NE;
    break;
  case 0xc:
  case 0x1c:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0x4000000);
    pTVar5 = c->v1;
    pTVar1 = c->v1;
    iVar2 = ctz32(0x8000000);
    iVar3 = ctz32(0x4000000);
    tcg_gen_shli_i32_m68k(tcg_ctx_00,pTVar5,pTVar1,iVar2 - iVar3);
    tcg_gen_andc_i32_m68k(tcg_ctx_00,c->v1,pTVar4,c->v1);
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,c->v1,0x9000000);
    c->tcond = TCG_COND_NE;
    break;
  case 0xd:
  case 0x1d:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0xd000000);
    c->tcond = TCG_COND_NE;
    break;
  case 0xe:
  case 0x1e:
    pTVar5 = tcg_temp_new_i32(tcg_ctx_00);
    c->v1 = pTVar5;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx_00,c->v1,pTVar4,0x4000000);
    c->tcond = TCG_COND_EQ;
    break;
  case 0xf:
  case 0x1f:
    c->v1 = c->v2;
    c->tcond = TCG_COND_ALWAYS;
  }
  tcg_temp_free_i32(tcg_ctx_00,pTVar4);
  return;
}

Assistant:

static void gen_fcc_cond(DisasCompare *c, DisasContext *s, int cond)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv fpsr;

    c->g1 = 1;
    c->v2 = tcg_const_i32(tcg_ctx, 0);
    c->g2 = 0;
    /* TODO: Raise BSUN exception.  */
    fpsr = tcg_temp_new(tcg_ctx);
    gen_load_fcr(s, fpsr, M68K_FPSR);
    switch (cond) {
    case 0:  /* False */
    case 16: /* Signaling False */
        c->v1 = c->v2;
        c->tcond = TCG_COND_NEVER;
        break;
    case 1:  /* EQual Z */
    case 17: /* Signaling EQual Z */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        c->tcond = TCG_COND_NE;
        break;
    case 2:  /* Ordered Greater Than !(A || Z || N) */
    case 18: /* Greater Than !(A || Z || N) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr,
                         FPSR_CC_A | FPSR_CC_Z | FPSR_CC_N);
        c->tcond = TCG_COND_EQ;
        break;
    case 3:  /* Ordered Greater than or Equal Z || !(A || N) */
    case 19: /* Greater than or Equal Z || !(A || N) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_A));
        tcg_gen_andi_i32(tcg_ctx, fpsr, fpsr, FPSR_CC_Z | FPSR_CC_N);
        tcg_gen_or_i32(tcg_ctx, c->v1, c->v1, fpsr);
        tcg_gen_xori_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 4:  /* Ordered Less Than !(!N || A || Z); */
    case 20: /* Less Than !(!N || A || Z); */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_xori_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_N);
        tcg_gen_andi_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N | FPSR_CC_A | FPSR_CC_Z);
        c->tcond = TCG_COND_EQ;
        break;
    case 5:  /* Ordered Less than or Equal Z || (N && !A) */
    case 21: /* Less than or Equal Z || (N && !A) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_A));
        tcg_gen_andc_i32(tcg_ctx, c->v1, fpsr, c->v1);
        tcg_gen_andi_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_Z | FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 6:  /* Ordered Greater or Less than !(A || Z) */
    case 22: /* Greater or Less than !(A || Z) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z);
        c->tcond = TCG_COND_EQ;
        break;
    case 7:  /* Ordered !A */
    case 23: /* Greater, Less or Equal !A */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        c->tcond = TCG_COND_EQ;
        break;
    case 8:  /* Unordered A */
    case 24: /* Not Greater, Less or Equal A */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        c->tcond = TCG_COND_NE;
        break;
    case 9:  /* Unordered or Equal A || Z */
    case 25: /* Not Greater or Less then A || Z */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z);
        c->tcond = TCG_COND_NE;
        break;
    case 10: /* Unordered or Greater Than A || !(N || Z)) */
    case 26: /* Not Less or Equal A || !(N || Z)) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_Z));
        tcg_gen_andi_i32(tcg_ctx, fpsr, fpsr, FPSR_CC_A | FPSR_CC_N);
        tcg_gen_or_i32(tcg_ctx, c->v1, c->v1, fpsr);
        tcg_gen_xori_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 11: /* Unordered or Greater or Equal A || Z || !N */
    case 27: /* Not Less Than A || Z || !N */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z | FPSR_CC_N);
        tcg_gen_xori_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 12: /* Unordered or Less Than A || (N && !Z) */
    case 28: /* Not Greater than or Equal A || (N && !Z) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_Z));
        tcg_gen_andc_i32(tcg_ctx, c->v1, fpsr, c->v1);
        tcg_gen_andi_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_A | FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 13: /* Unordered or Less or Equal A || Z || N */
    case 29: /* Not Greater Than A || Z || N */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z | FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 14: /* Not Equal !Z */
    case 30: /* Signaling Not Equal !Z */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        c->tcond = TCG_COND_EQ;
        break;
    case 15: /* True */
    case 31: /* Signaling True */
        c->v1 = c->v2;
        c->tcond = TCG_COND_ALWAYS;
        break;
    }
    tcg_temp_free(tcg_ctx, fpsr);
}